

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Stress::anon_unknown_0::TextureSamplerCase::init
          (TextureSamplerCase *this,EVP_PKEY_CTX *ctx)

{
  allocator<unsigned_char> *this_00;
  deUint32 *this_01;
  GLenum GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  int extraout_EAX;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  NotSupportedError *pNVar7;
  undefined4 extraout_var_00;
  long lVar8;
  reference pvVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  EVP_PKEY_CTX *ctx_00;
  int local_58c;
  undefined1 local_588 [4];
  int faceNdx;
  int local_404;
  undefined1 local_400 [4];
  int level;
  MessageBuilder local_280;
  int local_fc;
  int local_f8;
  int y;
  int x;
  Random rnd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texData;
  Functions *gl;
  string local_b8;
  int local_98;
  undefined1 local_91;
  GLint maxVertexTexUnits;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  TextureSamplerCase *pTStack_10;
  GLint maxTextureSize;
  TextureSamplerCase *this_local;
  undefined4 extraout_var_01;
  
  local_14 = 0;
  pTStack_10 = this;
  pRVar6 = gles2::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  ctx_00 = (EVP_PKEY_CTX *)&local_14;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))(0xd33);
  if (local_14 < 0x80) {
    local_91 = 1;
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"GL_MAX_TEXTURE_SIZE must be at least ",&local_59);
    de::toString<int>((string *)&maxVertexTexUnits,&Stress::(anonymous_namespace)::TEST_TEXTURE_SIZE
                     );
    std::operator+(&local_38,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxVertexTexUnits);
    tcu::NotSupportedError::NotSupportedError(pNVar7,&local_38);
    local_91 = 0;
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    local_98 = 0;
    pRVar6 = gles2::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
    iVar3 = (*pRVar6->_vptr_RenderContext[3])();
    ctx_00 = (EVP_PKEY_CTX *)&local_98;
    (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x868))(0x8b4c);
    if (local_98 < 1) {
      gl._6_1_ = 1;
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS must be at least 1",
                 (allocator<char> *)((long)&gl + 7));
      tcu::NotSupportedError::NotSupportedError(pNVar7,&local_b8);
      gl._6_1_ = 0;
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  RenderCase::init(&this->super_RenderCase,ctx_00);
  pRVar6 = gles2::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var_01,iVar3);
  this_00 = (allocator<unsigned_char> *)((long)&rnd.m_rnd.z + 3);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0x10000,this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&rnd.m_rnd.z + 3));
  de::Random::Random((Random *)&y,0x3039);
  (**(code **)(lVar8 + 0x6f8))(1,&this->m_textureID);
  for (local_f8 = 0; local_f8 < 0x80; local_f8 = local_f8 + 1) {
    for (local_fc = 0; local_fc < 0x80; local_fc = local_fc + 1) {
      dVar4 = de::Random::getUint32((Random *)&y);
      this_01 = &rnd.m_rnd.w;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
                          (long)((local_f8 * 0x80 + local_fc) * 4));
      *pvVar9 = (value_type)dVar4;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
                          (long)((local_f8 * 0x80 + local_fc) * 4 + 1));
      *pvVar9 = 0xff;
      dVar4 = de::Random::getUint32((Random *)&y);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,
                          (long)((local_f8 * 0x80 + local_fc) * 4 + 2));
      *pvVar9 = (value_type)dVar4;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,
                          (long)((local_f8 * 0x80 + local_fc) * 4 + 3));
      *pvVar9 = 0xff;
    }
  }
  if (this->m_testType == TEST_TEX_COORD) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_280,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_280,(char (*) [43])"Creating a 2D texture with a test pattern.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_280);
    (**(code **)(lVar8 + 0xb8))(0xde1,this->m_textureID);
    pcVar2 = *(code **)(lVar8 + 0x1310);
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0);
    (*pcVar2)(0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,pvVar9);
    (**(code **)(lVar8 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar8 + 0x1360))(0xde1,0x2801,0x2601);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"TextureSamplerCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x42b);
  }
  else if (this->m_testType == TEST_LOD) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_400,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_400,
                         (char (*) [53])"Creating a mipmapped 2D texture with a test pattern.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_400);
    (**(code **)(lVar8 + 0xb8))(0xde1,this->m_textureID);
    for (local_404 = 0; iVar3 = local_404, 0x80 >> ((byte)local_404 & 0x1f) != 0;
        local_404 = local_404 + 1) {
      pcVar2 = *(code **)(lVar8 + 0x1310);
      uVar5 = 0x80 >> ((byte)local_404 & 0x1f);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0);
      (*pcVar2)(0xde1,iVar3,0x1908,uVar5,uVar5,0,0x1908,0x1401,pvVar9);
    }
    (**(code **)(lVar8 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar8 + 0x1360))(0xde1,0x2801,0x2703);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"TextureSamplerCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x438);
  }
  else if (this->m_testType == TEST_TEX_COORD_CUBE) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_588,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_588,
                         (char (*) [41])"Creating a cube map with a test pattern.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_588);
    (**(code **)(lVar8 + 0xb8))(0x8513,this->m_textureID);
    for (local_58c = 0; local_58c < 6; local_58c = local_58c + 1) {
      pcVar2 = *(code **)(lVar8 + 0x1310);
      GVar1 = init::faces[local_58c];
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0);
      (*pcVar2)(GVar1,0,0x1908,0x20,0x20,0,0x1908,0x1401,pvVar9);
    }
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2800,0x2601);
    (**(code **)(lVar8 + 0x1360))(0x8513,0x2801,0x2601);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"TextureSamplerCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x451);
  }
  de::Random::~Random((Random *)&y);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w);
  return extraout_EAX;
}

Assistant:

void TextureSamplerCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	// vertex shader supports textures?
	if (m_type == TYPE_VERTEX)
	{
		GLint maxVertexTexUnits = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTexUnits);
		if (maxVertexTexUnits < 1)
			throw tcu::NotSupportedError("GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS must be at least 1");
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		std::vector<deUint8>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*4);
		de::Random				rnd		(12345);

		gl.genTextures(1, &m_textureID);

		for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
		for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
		{
			// RGBA8, green and alpha channel are always 255 for verification
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 0] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 1] = 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 2] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 3] = 0xFF;
		}

		if (m_testType == TEST_TEX_COORD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_LOD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a mipmapped 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);

			for (int level = 0; (TEST_TEXTURE_SIZE >> level); ++level)
				gl.texImage2D(GL_TEXTURE_2D, level, GL_RGBA, TEST_TEXTURE_SIZE >> level, TEST_TEXTURE_SIZE >> level, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_TEX_COORD_CUBE)
		{
			DE_STATIC_ASSERT(TEST_TEXTURE_CUBE_SIZE <= TEST_TEXTURE_SIZE);

			static const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
			};

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a cube map with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

			for (int faceNdx = 0; faceNdx < DE_LENGTH_OF_ARRAY(faces); ++faceNdx)
				gl.texImage2D(faces[faceNdx], 0, GL_RGBA, TEST_TEXTURE_CUBE_SIZE, TEST_TEXTURE_CUBE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else
			DE_ASSERT(DE_FALSE);
	}
}